

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateEnums.cpp
# Opt level: O1

ENUM__mathml__cn__type
COLLADASaxFWL15::toEnum_ENUM__mathml__cn__type
          (ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__cn__type> *enumMap,
          _func_StringHash_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *baseConversionFunc)

{
  StringHash SVar1;
  StringHash SVar2;
  ENUM__mathml__cn__type EVar3;
  pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__cn__type> *ppVar4;
  ulong uVar5;
  ENUM__mathml__cn__type *pEVar6;
  bool bVar7;
  
  ppVar4 = enumMap;
  SVar2 = (*baseConversionFunc)(buffer,bufferEnd,failed);
  pEVar6 = &enumMap->second;
  bVar7 = false;
  uVar5 = 0;
  do {
    SVar1 = ((pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__cn__type> *)(pEVar6 + -2))->first;
    if (SVar1 == SVar2) {
      *failed = false;
      ppVar4 = (pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__cn__type> *)(ulong)*pEVar6;
    }
    EVar3 = (ENUM__mathml__cn__type)ppVar4;
    if (SVar1 == SVar2) break;
    bVar7 = 5 < uVar5;
    uVar5 = uVar5 + 1;
    pEVar6 = pEVar6 + 4;
  } while (uVar5 != 7);
  if (bVar7) {
    *failed = true;
    EVar3 = ENUM__mathml__cn__type__COUNT;
  }
  return EVar3;
}

Assistant:

ENUM__mathml__cn__type toEnum_ENUM__mathml__cn__type (
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed,
    const std::pair<StringHash, ENUM__mathml__cn__type>* enumMap,
    StringHash (*baseConversionFunc)( const ParserChar**, const ParserChar*, bool& )
)
{
    return Utils::toEnum<ENUM__mathml__cn__type, StringHash, ENUM__mathml__cn__type__COUNT>(buffer, bufferEnd, failed, enumMap, baseConversionFunc);
}